

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall
cmCPackIFWInstaller::printSkippedOptionWarning
          (cmCPackIFWInstaller *this,string *optionName,string *optionValue)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  ostream *poVar2;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,"Option ");
  poVar2 = std::operator<<(poVar2,(string *)optionName);
  poVar2 = std::operator<<(poVar2," contains the value \"");
  poVar2 = std::operator<<(poVar2,(string *)optionValue);
  poVar2 = std::operator<<(poVar2,
                           "\" but will be skipped because the specified file does not exist.");
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    this_00 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWInstaller.cxx"
                    ,0x1f,local_1b8[0]);
    std::__cxx11::string::~string((string *)local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  return;
}

Assistant:

void cmCPackIFWInstaller::printSkippedOptionWarning(
  const std::string& optionName, const std::string& optionValue)
{
  cmCPackIFWLogger(
    WARNING,
    "Option "
      << optionName << " contains the value \"" << optionValue
      << "\" but will be skipped because the specified file does not exist."
      << std::endl);
}